

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

bool usesTheVariable(Instruction *I,string *var,bool isglobal,LLVMPointerAnalysis *pta)

{
  bool bVar1;
  long in_RCX;
  byte in_DL;
  const_iterator cVar2;
  const_iterator cVar3;
  LLVMMemoryRegion *region;
  const_iterator __end1;
  const_iterator __begin1;
  LLVMMemoryRegionSet *__range1;
  pair<bool,_dg::LLVMMemoryRegionSet> memacc;
  ConstantExpr *C_1;
  Value *A_1;
  LoadInst *L;
  ConstantExpr *C;
  Value *A;
  StoreInst *S;
  Value *operand;
  const_iterator *in_stack_ffffffffffffff18;
  const_iterator *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  ConstantExpr *in_stack_ffffffffffffff30;
  string *local_b8;
  Value *in_stack_ffffffffffffff58;
  Value *val;
  Instruction local_98 [8];
  Value aVStack_90 [48];
  ret_type local_60;
  Value *local_58;
  ret_type local_50;
  ret_type local_48;
  Value *local_40;
  ret_type local_38;
  Value *local_30;
  long local_28;
  byte local_19;
  byte local_1;
  
  local_19 = in_DL & 1;
  local_28 = in_RCX;
  bVar1 = llvm::Instruction::mayReadOrWriteMemory((Instruction *)in_stack_ffffffffffffff20);
  if (bVar1) {
    if (local_28 == 0) {
      local_30 = (Value *)0x0;
      local_38 = llvm::dyn_cast<llvm::StoreInst,llvm::Instruction_const>
                           ((Instruction *)in_stack_ffffffffffffff20);
      if (local_38 == (ret_type)0x0) {
        local_50 = llvm::dyn_cast<llvm::LoadInst,llvm::Instruction_const>
                             ((Instruction *)in_stack_ffffffffffffff20);
        if (local_50 != (ret_type)0x0) {
          llvm::LoadInst::getPointerOperand((LoadInst *)0x1e1387);
          local_58 = (Value *)llvm::Value::stripPointerCasts();
          local_60 = llvm::dyn_cast<llvm::ConstantExpr,llvm::Value_const>
                               ((Value *)in_stack_ffffffffffffff20);
          if (local_60 == (ret_type)0x0) {
            bVar1 = llvm::isa<llvm::AllocaInst,llvm::Value_const*>((Value **)0x1e13db);
            if ((bVar1) ||
               (bVar1 = llvm::isa<llvm::GlobalVariable,llvm::Value_const*>((Value **)0x1e13ec),
               bVar1)) {
              local_30 = local_58;
            }
          }
          else {
            local_30 = constExprVar(in_stack_ffffffffffffff30);
          }
        }
      }
      else {
        llvm::StoreInst::getPointerOperand((StoreInst *)0x1e12d4);
        local_40 = (Value *)llvm::Value::stripPointerCasts();
        local_48 = llvm::dyn_cast<llvm::ConstantExpr,llvm::Value_const>
                             ((Value *)in_stack_ffffffffffffff20);
        if (local_48 == (ret_type)0x0) {
          bVar1 = llvm::isa<llvm::AllocaInst,llvm::Value_const*>((Value **)0x1e1328);
          if ((bVar1) ||
             (bVar1 = llvm::isa<llvm::GlobalVariable,llvm::Value_const*>((Value **)0x1e1339), bVar1)
             ) {
            local_30 = local_40;
          }
        }
        else {
          local_30 = constExprVar(in_stack_ffffffffffffff30);
        }
      }
      if ((local_30 == (Value *)0x0) ||
         (bVar1 = mayBeTheVar(in_stack_ffffffffffffff58,local_b8), bVar1)) {
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
    else {
      dg::LLVMPointerAnalysis::getAccessedMemory(local_98);
      if (((byte)local_98[0] & 1) == 0) {
        val = aVStack_90;
        cVar2 = dg::LLVMMemoryRegionSet::begin((LLVMMemoryRegionSet *)in_stack_ffffffffffffff20);
        cVar3 = dg::LLVMMemoryRegionSet::end((LLVMMemoryRegionSet *)in_stack_ffffffffffffff20);
        while (bVar1 = dg::LLVMMemoryRegionSet::const_iterator::operator!=
                                 (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18), bVar1) {
          dg::LLVMMemoryRegionSet::const_iterator::operator*
                    ((const_iterator *)cVar3.it._M_node._M_node);
          if ((((local_19 & 1) == 0) ||
              (bVar1 = llvm::isa<llvm::GlobalVariable,llvm::Value*>((Value **)0x1e1523), bVar1)) &&
             (bVar1 = mayBeTheVar(val,(string *)cVar2.it._M_node._M_node), bVar1)) {
            local_1 = 1;
            goto LAB_001e1574;
          }
          dg::LLVMMemoryRegionSet::const_iterator::operator++(in_stack_ffffffffffffff20);
        }
        local_1 = 0;
      }
      else {
        llvm::errs();
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        llvm::operator<<((raw_ostream *)in_stack_ffffffffffffff20,(Value *)in_stack_ffffffffffffff18
                        );
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        local_1 = 1;
      }
LAB_001e1574:
      std::pair<bool,_dg::LLVMMemoryRegionSet>::~pair
                ((pair<bool,_dg::LLVMMemoryRegionSet> *)0x1e157e);
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

static bool usesTheVariable(const llvm::Instruction &I, const std::string &var,
                            bool isglobal = false,
                            LLVMPointerAnalysis *pta = nullptr) {
    if (!I.mayReadOrWriteMemory())
        return false;

    if (!pta) {
        // try basic cases that we can decide without PTA
        using namespace llvm;
        const Value *operand = nullptr;
        if (auto *S = dyn_cast<StoreInst>(&I)) {
            auto *A = S->getPointerOperand()->stripPointerCasts();
            if (auto *C = dyn_cast<ConstantExpr>(A)) {
                operand = constExprVar(C);
            } else if ((isa<AllocaInst>(A) || isa<GlobalVariable>(A))) {
                operand = A;
            }
        } else if (auto *L = dyn_cast<LoadInst>(&I)) {
            auto *A = L->getPointerOperand()->stripPointerCasts();
            if (auto *C = dyn_cast<ConstantExpr>(A)) {
                operand = constExprVar(C);
            } else if ((isa<AllocaInst>(A) || isa<GlobalVariable>(A))) {
                operand = A;
            }
        }

        if (operand && !mayBeTheVar(operand, var)) {
            return false;
        }
        return true;
    }

    auto memacc = pta->getAccessedMemory(&I);
    if (memacc.first) {
        // PTA has no information, it may be a definition of the variable,
        // we do not know
        llvm::errs() << "WARNING: matched due to a lack of information: " << I
                     << "\n";
        return true;
    }

    for (const auto &region : memacc.second) {
        if (isglobal &&
            !llvm::isa<llvm::GlobalVariable>(region.pointer.value)) {
            continue;
        }
        if (mayBeTheVar(region.pointer.value, var)) {
            return true;
        }
    }

    return false;
}